

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall QTextStreamPrivate::flushWriteBuffer(QTextStreamPrivate *this)

{
  QArrayData *data;
  undefined1 *puVar1;
  size_t __n;
  void *extraout_RDX_00;
  void *__buf;
  long in_FS_OFFSET;
  QStringView in;
  QByteArray local_28;
  long local_10;
  void *extraout_RDX;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->string == (QString *)0x0) && (this->device != (QIODevice *)0x0)) &&
      (this->status == Ok)) && (__n = (this->writeBuffer).d.size, __n != 0)) {
    local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    in.m_size = __n;
    in.m_data = (this->writeBuffer).d.ptr;
    QStringEncoder::encodeAsByteArray(&local_28,&this->fromUtf16,in);
    __buf = extraout_RDX;
    if ((this->writeBuffer).d.ptr != (char16_t *)0x0) {
      data = &((this->writeBuffer).d.d)->super_QArrayData;
      (this->writeBuffer).d.d = (Data *)0x0;
      (this->writeBuffer).d.ptr = (char16_t *)0x0;
      (this->writeBuffer).d.size = 0;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
          __buf = extraout_RDX_00;
        }
      }
    }
    this->hasWrittenData = true;
    puVar1 = (undefined1 *)QIODevice::write(this->device,(int)&local_28,__buf,__n);
    if (((long)puVar1 < 1) || (puVar1 != (undefined1 *)local_28.d.size)) {
      this->status = WriteFailed;
    }
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::flushWriteBuffer()
{
    // no buffer next to the QString itself; this function should only
    // be called internally, for devices.
    if (string || !device)
        return;

    // Stream went bye-bye already. Appending further data may succeed again,
    // but would create a corrupted stream anyway.
    if (status != QTextStream::Ok)
        return;

    if (writeBuffer.isEmpty())
        return;

#if defined (Q_OS_WIN)
    // handle text translation and bypass the Text flag in the device.
    bool textModeEnabled = device->isTextModeEnabled();
    if (textModeEnabled) {
        device->setTextModeEnabled(false);
        writeBuffer.replace(u'\n', "\r\n"_L1);
    }
#endif

    QByteArray data = fromUtf16(writeBuffer);
    writeBuffer.clear();
    hasWrittenData = true;

    // write raw data to the device
    qint64 bytesWritten = device->write(data);
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::flushWriteBuffer(), device->write(\"%s\") == %d",
           QtDebugUtils::toPrintable(data.constData(), data.size(), 32).constData(),
           int(bytesWritten));
#endif

#if defined (Q_OS_WIN)
    // reset the text flag
    if (textModeEnabled)
        device->setTextModeEnabled(true);
#endif

    if (bytesWritten <= 0) {
        status = QTextStream::WriteFailed;
        return;
    }

    // flush the file
#ifndef QT_NO_QOBJECT
    QFileDevice *file = qobject_cast<QFileDevice *>(device);
    bool flushed = !file || file->flush();
#else
    bool flushed = true;
#endif

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::flushWriteBuffer() wrote %d bytes", int(bytesWritten));
#endif
    if (!flushed || bytesWritten != qint64(data.size()))
        status = QTextStream::WriteFailed;
}